

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O0

int slowreturn(void)

{
  DLword DVar1;
  LispPTR LVar2;
  DLword *pDVar3;
  Bframe *pBVar4;
  LispPTR *pLVar5;
  DLword *local_60;
  DLword *ac_freeptr_2;
  DLword *ac_ptr68k_2;
  DLword *ac_freeptr_1;
  DLword *ac_ptr68k_1;
  DLword *ac_freeptr;
  DLword *ac_ptr68k;
  FX *returnFX;
  Bframe *currentBF;
  DLword *freeptr;
  DLword *next68k;
  
  ac_ptr68k = (DLword *)NativeAligned4FromStackOffset(MachineState.pvar[-10] - 0xb);
  if ((MachineState.pvar[-10] & 0xfffe) != MachineState.pvar[-2]) {
    if ((*(uint *)(MachineState.pvar + -10) & 1) == 0) {
      LVar2 = LAddrFromNative(MachineState.pvar + -0xc);
      MachineState.pvar[-1] = (DLword)LVar2;
      MachineState.pvar[-2] = MachineState.pvar[-10];
    }
    MachineState.pvar[-10] = MachineState.pvar[-2] + 0xb;
    decusecount68k((FX *)ac_ptr68k);
    ac_ptr68k = (DLword *)NativeAligned4FromStackOffset(MachineState.pvar[-2] - 10);
  }
  if ((ac_ptr68k[1] & 0xff) != 0) {
    MachineState.csp = MachineState.csp + 2;
    DVar1 = StackOffsetFromNative(MachineState.csp);
    MachineState.pvar[-5] = DVar1;
    *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
    *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
         (short)((ulong)((long)MachineState.endofstack - (long)MachineState.csp) >> 1);
    if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
      error("0-long free block.");
    }
    ac_ptr68k = &make_FXcopy((FX *)ac_ptr68k)->alink;
    if ((FX *)ac_ptr68k == (FX *)0x0) {
      return 1;
    }
    pDVar3 = NativeAligned2FromStackOffset(MachineState.pvar[-5]);
    ac_ptr68k_1 = pDVar3;
    if (*(short *)((ulong)pDVar3 ^ 2) != -0x6000) {
      error("pre_moveframe: MP9316");
    }
    while (*(short *)((ulong)ac_ptr68k_1 ^ 2) == -0x6000) {
      MachineState.endofstack = ac_ptr68k_1 + (int)(uint)*(ushort *)((ulong)(ac_ptr68k_1 + 1) ^ 2);
      ac_ptr68k_1 = MachineState.endofstack;
    }
    MachineState.csp = pDVar3 + -2;
  }
LAB_0013d265:
  do {
    pBVar4 = (Bframe *)NativeAligned2FromStackOffset(ac_ptr68k[5]);
    pLVar5 = NativeAligned4FromStackOffset(MachineState.pvar[-1]);
    if (*(short *)((ulong)pBVar4 ^ 2) == -0x6000) {
LAB_0013d2a6:
      currentBF = (Bframe *)(MachineState.pvar + -0xc);
      if ((MachineState.pvar[-0xb] >> 9 & 1) == 0) {
        currentBF = (Bframe *)MachineState.ivar;
      }
      else if ((*pLVar5 & 0xff0000) == 0) {
        *(undefined2 *)((ulong)MachineState.ivar ^ 2) = 0xa000;
        *(short *)((ulong)(MachineState.ivar + 1) ^ 2) =
             (short)((ulong)((long)pLVar5 - (long)MachineState.ivar) >> 1) + 2;
        if (*(short *)((ulong)(MachineState.ivar + 1) ^ 2) == 0) {
          error("creating 0-len block");
        }
      }
      else {
        *(ushort *)((long)pLVar5 + 2) =
             *(ushort *)((long)pLVar5 + 2) & 0xff00 |
             (*(ushort *)((long)pLVar5 + 2) & 0xff) - 1 & 0xff;
      }
      *(undefined2 *)((ulong)currentBF ^ 2) = 0xa000;
      *(short *)((ulong)&currentBF->field_0x2 ^ 2) =
           (short)((ulong)((long)MachineState.endofstack - (long)currentBF) >> 1);
      if (*(short *)((ulong)&currentBF->field_0x2 ^ 2) == 0) {
        error("creating 0-len block");
      }
      MachineState.pvar = ac_ptr68k + 10;
      currentBF = pBVar4;
      if (*(short *)((ulong)pBVar4 ^ 2) != -0x6000) {
        error("OP_return: MP9316");
      }
      while (*(short *)((ulong)currentBF ^ 2) == -0x6000) {
        MachineState.endofstack =
             &currentBF->ivar + (int)(uint)*(ushort *)((ulong)&currentBF->field_0x2 ^ 2);
        currentBF = (Bframe *)MachineState.endofstack;
      }
      if ((MachineState.pvar[-9] >> 10 & 1) == 0) {
        if ((MachineState.pvar[-9] >> 8 & 1) == 0) {
          MachineState.csp = &pBVar4[-1].ivar;
        }
        else {
          MachineState.pvar[-9] = MachineState.pvar[-9] & 0xfeff;
          MachineState.tosvalue = *(LispPTR *)(pBVar4 + -1);
          MachineState.csp = &pBVar4[-2].ivar;
        }
        MachineState.ivar =
             NativeAligned2FromStackOffset(*(DLword *)((ulong)(MachineState.pvar + -0xb) ^ 2));
        MachineState.currentfunc =
             (fnhead *)NativeAligned4FromLAddr(*(LispPTR *)(MachineState.pvar + -8));
        MachineState.currentpc =
             (ByteCode *)
             ((long)&(MachineState.currentfunc)->na + (long)(int)(uint)MachineState.pvar[-6]);
      }
      else {
        error("Stack error: INCALL bit found in returnee frame");
LAB_0013d910:
        error("Control reached end of slowreturn()!");
      }
      return 0;
    }
    if (pBVar4 == (Bframe *)MachineState.ivar) {
      if ((*pLVar5 & 0xff0000) == 0) {
        if ((pBVar4 != (Bframe *)MachineState.ivar) && ((*pLVar5 & 0xff0000) != 0)) {
          error("Shouldn\'t");
          goto LAB_0013d910;
        }
        goto LAB_0013d2a6;
      }
      MachineState.csp = MachineState.csp + 2;
      DVar1 = StackOffsetFromNative(MachineState.csp);
      MachineState.pvar[-5] = DVar1;
      *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
      *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
           (short)((ulong)((long)MachineState.endofstack - (long)MachineState.csp) >> 1);
      if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
        error("0-long free block.");
      }
      ac_ptr68k = &make_FXcopy((FX *)ac_ptr68k)->alink;
      if ((FX *)ac_ptr68k == (FX *)0x0) {
        return 1;
      }
      pDVar3 = NativeAligned2FromStackOffset(MachineState.pvar[-5]);
      local_60 = pDVar3;
      if (*(short *)((ulong)pDVar3 ^ 2) != -0x6000) {
        error("pre_moveframe: MP9316");
      }
      while (*(short *)((ulong)local_60 ^ 2) == -0x6000) {
        MachineState.endofstack = local_60 + (int)(uint)*(ushort *)((ulong)(local_60 + 1) ^ 2);
        local_60 = MachineState.endofstack;
      }
      MachineState.csp = pDVar3 + -2;
      goto LAB_0013d265;
    }
    MachineState.csp = MachineState.csp + 2;
    DVar1 = StackOffsetFromNative(MachineState.csp);
    MachineState.pvar[-5] = DVar1;
    *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
    *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
         (short)((ulong)((long)MachineState.endofstack - (long)MachineState.csp) >> 1);
    if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
      error("0-long free block.");
    }
    ac_ptr68k = &make_FXcopy((FX *)ac_ptr68k)->alink;
    if ((FX *)ac_ptr68k == (FX *)0x0) {
      return 1;
    }
    pDVar3 = NativeAligned2FromStackOffset(MachineState.pvar[-5]);
    ac_ptr68k_2 = pDVar3;
    if (*(short *)((ulong)pDVar3 ^ 2) != -0x6000) {
      error("pre_moveframe: MP9316");
    }
    while (*(short *)((ulong)ac_ptr68k_2 ^ 2) == -0x6000) {
      MachineState.endofstack = ac_ptr68k_2 + (int)(uint)*(ushort *)((ulong)(ac_ptr68k_2 + 1) ^ 2);
      ac_ptr68k_2 = MachineState.endofstack;
    }
    MachineState.csp = pDVar3 + -2;
  } while( true );
}

Assistant:

int slowreturn(void) {
  DLword *next68k;
  DLword *freeptr;
  Bframe *currentBF;
  FX *returnFX;

  S_CHECK(SLOWP(CURRENTFX), "CURRENTFX not SLOWP");

  /* Get returnee's FX from CURRENTFX->alink , It's SLOWP case */
  returnFX = (FX *)NativeAligned4FromStackOffset(CURRENTFX->alink - 11);

  if ((CURRENTFX->alink & 0xFFFE) != CURRENTFX->clink) { /* ALINK != CLINK */
#ifdef STACKCHECK
    printf("A!=C\n");
#endif
    /* return to CLINK fx */
    SETALINK(CURRENTFX, CURRENTFX->clink);
    decusecount68k(returnFX);
    returnFX = (FX *)NativeAligned4FromStackOffset(CURRENTFX->clink - FRAMESIZE);
  }

  if (returnFX->usecount != 0) { /* COPY returnee's FX */
#ifdef STACKCHECK
    printf("returnFX->usecount !=0\n");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
  }

retry: /* this is retry entry after MAKE_FXCOPY etc */

  next68k = NativeAligned2FromStackOffset(returnFX->nextblock);
  currentBF = (Bframe *)NativeAligned4FromStackOffset(CURRENTFX->blink);

  if (GETWORD(next68k) == STK_FSB_WORD) {
  another:
    freeptr = ((DLword *)CURRENTFX) - 2;
    if (BFRAMEPTR(freeptr)->residual) {
      if (BFRAMEPTR(currentBF)->usecnt == 0) {
        /* make FREEBLOCK for real BF */
        GETWORD(IVar) = STK_FSB_WORD;
        GETWORD(IVar + 1) = (((UNSIGNED)currentBF - (UNSIGNED)IVar) >> 1) + 2;
        if (0 == GETWORD(IVar + 1)) error("creating 0-len block");
      } else
        BFRAMEPTR(currentBF)->usecnt--;
    } else
      freeptr = IVar; /* reset free ptr: not residual case */

    /* free FX + BF(dummy or real) */
    GETWORD(freeptr) = STK_FSB_WORD;
    GETWORD(freeptr + 1) = ((UNSIGNED)EndSTKP - (UNSIGNED)freeptr) >> 1;
    if (0 == GETWORD(freeptr + 1)) error("creating 0-len block");
    S_CHECK(EndSTKP >= freeptr, "EndSTKP < freeptr!");
    S_CHECK(FSB_size(freeptr) >= MINEXTRASTACKWORDS,
            "free block < min size, after deciding it fits.");

    PVar = ((DLword *)returnFX) + FRAMESIZE;
    /*  Now right CURRENTFX(PVar) is set */

    if (GETWORD(next68k) != STK_FSB_WORD) error("OP_return: MP9316");

    freeptr = next68k;
    while (GETWORD(freeptr) == STK_FSB_WORD) EndSTKP = freeptr = freeptr + GETWORD(freeptr + 1);

    if (CURRENTFX->incall) { /* this frame is  Interrupted */
      error("Stack error: INCALL bit found in returnee frame");
    } else {
      if (CURRENTFX->nopush) {
        CURRENTFX->nopush = NIL;
        CurrentStackPTR = next68k - 2;
        TopOfStack = *((LispPTR *)CurrentStackPTR);
        CurrentStackPTR -= 2;

      } else
        CurrentStackPTR = next68k - 2;

      S_CHECK(EndSTKP >= freeptr, "EndSTKP < freeptr");

      FastRetCALL;
#ifdef LISPTRACE
      printf("TRACE: return from ");
      print(fnobj->framename);
      printf(" :<= ");
      print(TopOfStack);
      printf("\n");
#endif
      return (0); /* normal return */
    }

  } /* FSB end */
  else if (next68k != IVar) {
#ifdef STACKCHECK
    printf("next68k != IVar and not FSB\n");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
    goto retry;
  } else if (BFRAMEPTR(currentBF)->usecnt != 0) {
#ifdef STACKCHECK
    printf("currentBF->usecnt != 0");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
    goto retry;
  } else {
    if ((next68k == IVar) || (BFRAMEPTR(currentBF)->usecnt == 0))
      goto another;
    else
      error("Shouldn't");
  }
  error("Control reached end of slowreturn()!");
  return (NIL); /* NOT REACHED */
}